

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O0

void __thiscall TestMustache::testContextLookup(TestMustache *this)

{
  QVariant *pQVar1;
  QString local_288;
  undefined1 local_270 [8];
  QString output;
  undefined1 local_238 [8];
  QtVariantContext context;
  Renderer renderer;
  QString _template;
  QVariant local_130;
  QVariant local_110;
  QString local_f0;
  QVariant local_d8;
  QHash<QString,_QVariant> local_b8;
  QVariantHash file;
  QVariantList files;
  QVariant local_80;
  QString local_60;
  QVariant local_38;
  QHash<QString,_QVariant> local_18;
  QVariantHash fileMap;
  TestMustache *this_local;
  
  fileMap.d = (Data *)this;
  QHash<QString,_QVariant>::QHash(&local_18);
  ::QVariant::QVariant(&local_38,"/home/robert");
  QString::QString(&local_60,"dir");
  pQVar1 = QHash<QString,_QVariant>::operator[](&local_18,&local_60);
  ::QVariant::operator=(pQVar1,&local_38);
  QString::~QString(&local_60);
  ::QVariant::~QVariant(&local_38);
  ::QVariant::QVariant(&local_80,"robert");
  QString::QString((QString *)&files.d.size,"name");
  pQVar1 = QHash<QString,_QVariant>::operator[](&local_18,(QString *)&files.d.size);
  ::QVariant::operator=(pQVar1,&local_80);
  QString::~QString((QString *)&files.d.size);
  ::QVariant::~QVariant(&local_80);
  QList<QVariant>::QList((QList<QVariant> *)&file);
  QHash<QString,_QVariant>::QHash(&local_b8);
  ::QVariant::QVariant(&local_d8,"test.pdf");
  QString::QString(&local_f0,"name");
  pQVar1 = QHash<QString,_QVariant>::operator[](&local_b8,&local_f0);
  ::QVariant::operator=(pQVar1,&local_d8);
  QString::~QString(&local_f0);
  ::QVariant::~QVariant(&local_d8);
  ::QVariant::QVariant(&local_110,(QHash_conflict *)&local_b8);
  QList<QVariant>::operator<<((QList<QVariant> *)&file,&local_110);
  ::QVariant::~QVariant(&local_110);
  ::QVariant::QVariant(&local_130,(QList_conflict1 *)&file);
  QString::QString((QString *)&_template.d.size,"files");
  pQVar1 = QHash<QString,_QVariant>::operator[](&local_18,(QString *)&_template.d.size);
  ::QVariant::operator=(pQVar1,&local_130);
  QString::~QString((QString *)&_template.d.size);
  ::QVariant::~QVariant(&local_130);
  QString::QString((QString *)&renderer.m_defaultTagEndMarker.d.size,
                   "{{#files}}{{dir}}/{{name}}{{/files}}");
  Mustache::Renderer::Renderer((Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size);
  ::QVariant::QVariant((QVariant *)&output.d.size,(QHash_conflict *)&local_18);
  Mustache::QtVariantContext::QtVariantContext
            ((QtVariantContext *)local_238,(QVariant *)&output.d.size,(PartialResolver *)0x0);
  ::QVariant::~QVariant((QVariant *)&output.d.size);
  Mustache::Renderer::render
            ((QString *)local_270,(Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size,
             (QString *)&renderer.m_defaultTagEndMarker.d.size,(Context *)local_238);
  QString::QString(&local_288,"/home/robert/test.pdf");
  QTest::qCompare((QString *)local_270,&local_288,"output","QString(\"/home/robert/test.pdf\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                  ,0xd8);
  QString::~QString(&local_288);
  QString::~QString((QString *)local_270);
  Mustache::QtVariantContext::~QtVariantContext((QtVariantContext *)local_238);
  Mustache::Renderer::~Renderer((Renderer *)&context.m_contextStack.super_QList<QVariant>.d.size);
  QString::~QString((QString *)&renderer.m_defaultTagEndMarker.d.size);
  QHash<QString,_QVariant>::~QHash(&local_b8);
  QList<QVariant>::~QList((QList<QVariant> *)&file);
  QHash<QString,_QVariant>::~QHash(&local_18);
  return;
}

Assistant:

void TestMustache::testContextLookup()
{
	QVariantHash fileMap;
	fileMap["dir"] = "/home/robert";
	fileMap["name"] = "robert";

	QVariantList files;
	QVariantHash file;
	file["name"] = "test.pdf";
	files << file;

	fileMap["files"] = files;

	QString _template = "{{#files}}{{dir}}/{{name}}{{/files}}";

	Mustache::Renderer renderer;
	Mustache::QtVariantContext context(fileMap);
	QString output = renderer.render(_template, &context);

	QCOMPARE(output, QString("/home/robert/test.pdf"));
}